

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::CacheState::barrier
          (CacheState *this,VkPipelineStageFlags srcStages,VkAccessFlags srcAccesses,
          VkPipelineStageFlags dstStages,VkAccessFlags dstAccesses)

{
  bool bVar1;
  PipelineStage PVar2;
  PipelineStage PVar3;
  PipelineStage PVar4;
  VkPipelineStageFlagBits local_430;
  PipelineStage srcStage_1;
  VkPipelineStageFlags srcStage__1;
  VkPipelineStageFlagBits VStack_424;
  bool allWritesAvailable;
  PipelineStage dstStage_1;
  VkPipelineStageFlags dstStage__1;
  PipelineStage sharedStage;
  VkPipelineStageFlags sharedStage_;
  PipelineStage dstStage;
  VkPipelineStageFlags dstStage_;
  PipelineStage srcStage;
  VkPipelineStageFlags srcStage_;
  bool oldUnavailableLayoutTransition [15];
  VkAccessFlags oldUnavailableWriteOperations [15] [15];
  uint local_68 [2];
  VkPipelineStageFlags oldIncompleteOperations [15];
  VkAccessFlags dstAccesses_local;
  VkPipelineStageFlags dstStages_local;
  VkAccessFlags srcAccesses_local;
  VkPipelineStageFlags srcStages_local;
  CacheState *this_local;
  
  ::deMemcpy(local_68,this->m_incompleteOperations,0x3c);
  ::deMemcpy(oldUnavailableLayoutTransition + 7,this->m_unavailableWriteOperations,900);
  ::deMemcpy((byte *)((long)&srcStage + 1),this->m_unavailableLayoutTransition,0xf);
  for (dstStage_ = 1; dstStage_ <= srcStages; dstStage_ = dstStage_ << 1) {
    PVar2 = pipelineStageFlagToPipelineStage(dstStage_);
    if ((dstStage_ & srcStages) != 0) {
      for (sharedStage_ = 1; sharedStage_ <= dstStages; sharedStage_ = sharedStage_ << 1) {
        PVar3 = pipelineStageFlagToPipelineStage(sharedStage_);
        if ((sharedStage_ & dstStages) != 0) {
          this->m_incompleteOperations[PVar3] =
               oldIncompleteOperations[(ulong)PVar2 - 2] & this->m_incompleteOperations[PVar3];
          this->m_unavailableLayoutTransition[PVar3] =
               (this->m_unavailableLayoutTransition[PVar3] & 1U &
               *(byte *)((long)&srcStage + (ulong)PVar2 + 1) & 1) != 0;
          for (dstStage__1 = 1; dstStage__1 <= this->m_allowedStages; dstStage__1 = dstStage__1 << 1
              ) {
            PVar4 = pipelineStageFlagToPipelineStage(dstStage__1);
            if ((dstStage__1 & this->m_allowedStages) != 0) {
              this->m_unavailableWriteOperations[PVar3][PVar4] =
                   oldUnavailableWriteOperations[(ulong)PVar2 - 1][(ulong)PVar4 + 0xd] &
                   this->m_unavailableWriteOperations[PVar3][PVar4];
            }
          }
        }
      }
    }
  }
  for (VStack_424 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; VStack_424 <= dstStages;
      VStack_424 = VStack_424 << 1) {
    PVar2 = pipelineStageFlagToPipelineStage(VStack_424);
    bVar1 = true;
    if ((VStack_424 & dstStages) != 0) {
      this->m_incompleteOperations[PVar2] =
           (srcStages ^ 0xffffffff) & this->m_incompleteOperations[PVar2];
      for (local_430 = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; local_430 <= this->m_allowedStages;
          local_430 = local_430 << 1) {
        PVar3 = pipelineStageFlagToPipelineStage(local_430);
        if ((local_430 & this->m_allowedStages) != 0) {
          if ((local_430 & srcStages) != 0) {
            this->m_unavailableWriteOperations[PVar2][PVar3] =
                 (srcAccesses ^ 0xffffffff) & this->m_unavailableWriteOperations[PVar2][PVar3];
          }
          if (this->m_unavailableWriteOperations[PVar2][PVar3] != 0) {
            bVar1 = false;
          }
        }
      }
      if (bVar1) {
        this->m_invisibleOperations[PVar2] =
             (dstAccesses ^ 0xffffffff) & this->m_invisibleOperations[PVar2];
      }
    }
  }
  return;
}

Assistant:

void CacheState::barrier (vk::VkPipelineStageFlags	srcStages,
						  vk::VkAccessFlags			srcAccesses,
						  vk::VkPipelineStageFlags	dstStages,
						  vk::VkAccessFlags			dstAccesses)
{
	DE_ASSERT((srcStages & (~m_allowedStages)) == 0);
	DE_ASSERT((srcAccesses & (~m_allowedAccesses)) == 0);
	DE_ASSERT((dstStages & (~m_allowedStages)) == 0);
	DE_ASSERT((dstAccesses & (~m_allowedAccesses)) == 0);

	// Transitivity
	{
		vk::VkPipelineStageFlags		oldIncompleteOperations[PIPELINESTAGE_LAST];
		vk::VkAccessFlags				oldUnavailableWriteOperations[PIPELINESTAGE_LAST][PIPELINESTAGE_LAST];
		bool							oldUnavailableLayoutTransition[PIPELINESTAGE_LAST];

		deMemcpy(oldIncompleteOperations, m_incompleteOperations, sizeof(oldIncompleteOperations));
		deMemcpy(oldUnavailableWriteOperations, m_unavailableWriteOperations, sizeof(oldUnavailableWriteOperations));
		deMemcpy(oldUnavailableLayoutTransition, m_unavailableLayoutTransition, sizeof(oldUnavailableLayoutTransition));

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= srcStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & srcStages) == 0)
				continue;

			for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
			{
				const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

				if ((dstStage_ & dstStages) == 0)
					continue;

				// Stages that have completed before srcStage have also completed before dstStage
				m_incompleteOperations[dstStage] &= oldIncompleteOperations[srcStage];

				// Image layout transition in srcStage are now available in dstStage
				m_unavailableLayoutTransition[dstStage] &= oldUnavailableLayoutTransition[srcStage];

				for (vk::VkPipelineStageFlags sharedStage_ = 1; sharedStage_ <= m_allowedStages; sharedStage_ <<= 1)
				{
					const PipelineStage	sharedStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)sharedStage_);

					if ((sharedStage_ & m_allowedStages) == 0)
						continue;

					// Writes that are available in srcStage are also available in dstStage
					m_unavailableWriteOperations[dstStage][sharedStage] &= oldUnavailableWriteOperations[srcStage][sharedStage];
				}
			}
		}
	}

	// Barrier
	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= dstStages; dstStage_ <<= 1)
	{
		const PipelineStage	dstStage			= pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);
		bool				allWritesAvailable	= true;

		if ((dstStage_ & dstStages) == 0)
			continue;

		// Operations in srcStages have completed before any stage in dstStages
		m_incompleteOperations[dstStage] &= ~srcStages;

		for (vk::VkPipelineStageFlags srcStage_ = 1; srcStage_ <= m_allowedStages; srcStage_ <<= 1)
		{
			const PipelineStage srcStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)srcStage_);

			if ((srcStage_ & m_allowedStages) == 0)
				continue;

			// Make srcAccesses from srcStage available in dstStage
			if ((srcStage_ & srcStages) != 0)
				m_unavailableWriteOperations[dstStage][srcStage] &= ~srcAccesses;

			if (m_unavailableWriteOperations[dstStage][srcStage] != 0)
				allWritesAvailable = false;
		}

		// If all writes are available in dstStage make dstAccesses also visible
		if (allWritesAvailable)
			m_invisibleOperations[dstStage] &= ~dstAccesses;
	}
}